

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ForLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForLoopStatementSyntax,slang::syntax::ForLoopStatementSyntax_const&>
          (BumpAllocator *this,ForLoopStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  ForLoopStatementSyntax *pFVar14;
  
  pFVar14 = (ForLoopStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForLoopStatementSyntax *)this->endPtr < pFVar14 + 1) {
    pFVar14 = (ForLoopStatementSyntax *)allocateSlow(this,0x128,8);
  }
  else {
    this->head->current = (byte *)(pFVar14 + 1);
  }
  (pFVar14->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pFVar14->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar14->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pFVar14->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pFVar14->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar5;
  (pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pFVar14->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pFVar14->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pFVar14->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0da0;
  TVar9 = (args->forKeyword).kind;
  uVar10 = (args->forKeyword).field_0x2;
  NVar11.raw = (args->forKeyword).numFlags.raw;
  uVar12 = (args->forKeyword).rawLen;
  pIVar3 = (args->forKeyword).info;
  uVar6 = (args->openParen).field_0x2;
  NVar7.raw = (args->openParen).numFlags.raw;
  uVar8 = (args->openParen).rawLen;
  pIVar4 = (args->openParen).info;
  (pFVar14->openParen).kind = (args->openParen).kind;
  (pFVar14->openParen).field_0x2 = uVar6;
  (pFVar14->openParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar14->openParen).rawLen = uVar8;
  (pFVar14->openParen).info = pIVar4;
  (pFVar14->forKeyword).kind = TVar9;
  (pFVar14->forKeyword).field_0x2 = uVar10;
  (pFVar14->forKeyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pFVar14->forKeyword).rawLen = uVar12;
  (pFVar14->forKeyword).info = pIVar3;
  uVar5 = *(undefined4 *)&(args->initializers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->initializers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar14->initializers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->initializers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar14->initializers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pFVar14->initializers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar14->initializers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->initializers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar14->initializers).super_SyntaxListBase.childCount =
       (args->initializers).super_SyntaxListBase.childCount;
  (pFVar14->initializers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b1848;
  sVar2 = (args->initializers).elements._M_extent._M_extent_value;
  (pFVar14->initializers).elements._M_ptr = (args->initializers).elements._M_ptr;
  (pFVar14->initializers).elements._M_extent._M_extent_value = sVar2;
  (pFVar14->semi2).info = (args->semi2).info;
  TVar13 = (args->semi1).kind;
  uVar10 = (args->semi1).field_0x2;
  NVar11.raw = (args->semi1).numFlags.raw;
  uVar12 = (args->semi1).rawLen;
  pIVar3 = (args->semi1).info;
  TVar9 = (args->semi2).kind;
  uVar6 = (args->semi2).field_0x2;
  NVar7.raw = (args->semi2).numFlags.raw;
  uVar8 = (args->semi2).rawLen;
  pFVar14->stopExpr = args->stopExpr;
  (pFVar14->semi2).kind = TVar9;
  (pFVar14->semi2).field_0x2 = uVar6;
  (pFVar14->semi2).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar14->semi2).rawLen = uVar8;
  (pFVar14->semi1).kind = TVar13;
  (pFVar14->semi1).field_0x2 = uVar10;
  (pFVar14->semi1).numFlags = (NumericTokenFlags)NVar11.raw;
  (pFVar14->semi1).rawLen = uVar12;
  (pFVar14->semi1).info = pIVar3;
  uVar5 = *(undefined4 *)&(args->steps).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->steps).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar14->steps).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->steps).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar14->steps).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pFVar14->steps).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar14->steps).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->steps).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar14->steps).super_SyntaxListBase.childCount = (args->steps).super_SyntaxListBase.childCount;
  (pFVar14->steps).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b12b0;
  sVar2 = (args->steps).elements._M_extent._M_extent_value;
  (pFVar14->steps).elements._M_ptr = (args->steps).elements._M_ptr;
  (pFVar14->steps).elements._M_extent._M_extent_value = sVar2;
  uVar6 = (args->closeParen).field_0x2;
  NVar7.raw = (args->closeParen).numFlags.raw;
  uVar8 = (args->closeParen).rawLen;
  pIVar3 = (args->closeParen).info;
  (pFVar14->closeParen).kind = (args->closeParen).kind;
  (pFVar14->closeParen).field_0x2 = uVar6;
  (pFVar14->closeParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar14->closeParen).rawLen = uVar8;
  (pFVar14->closeParen).info = pIVar3;
  (pFVar14->statement).ptr = (args->statement).ptr;
  return pFVar14;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }